

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# PrintTools.h
# Opt level: O2

string * PrintTools::SoftPrintVector<double>
                   (string *__return_storage_ptr__,vector<double,_std::allocator<double>_> *v)

{
  double *pdVar1;
  double *pdVar2;
  stringstream ss;
  string local_360 [32];
  stringstream local_340 [16];
  ostream local_330 [376];
  stringstream local_1b8 [392];
  
  std::__cxx11::stringstream::stringstream(local_340);
  pdVar2 = (v->super__Vector_base<double,_std::allocator<double>_>)._M_impl.super__Vector_impl_data.
           _M_start;
  pdVar1 = (v->super__Vector_base<double,_std::allocator<double>_>)._M_impl.super__Vector_impl_data.
           _M_finish;
  std::operator<<(local_330,"< ");
  for (; pdVar2 != pdVar1; pdVar2 = pdVar2 + 1) {
    if (pdVar2 != (v->super__Vector_base<double,_std::allocator<double>_>)._M_impl.
                  super__Vector_impl_data._M_start) {
      std::operator<<(local_330,", ");
    }
    std::__cxx11::stringstream::stringstream(local_1b8);
    std::ostream::_M_insert<double>(*pdVar2);
    std::__cxx11::stringbuf::str();
    std::__cxx11::stringstream::~stringstream(local_1b8);
    std::operator<<(local_330,local_360);
    std::__cxx11::string::~string(local_360);
  }
  std::operator<<(local_330," >");
  std::__cxx11::stringbuf::str();
  std::__cxx11::stringstream::~stringstream(local_340);
  return __return_storage_ptr__;
}

Assistant:

static std::string SoftPrintVector(const std::vector<T> &v)
{
    std::stringstream ss;
    typename std::vector<T>::const_iterator it =  v.begin();
    typename std::vector<T>::const_iterator last =  v.end();
    ss << "< ";
    while(it != last)
    {
        if(it != v.begin())
            ss << ", ";

        ss << SoftPrintVector(*it);        
        it++;
    }
    ss << " >";
    return(ss.str());
}